

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::
     iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::Print(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,iu_ostream *os
            )

{
  iu_ostream *os_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  
  UniversalPrintTo<std::__cxx11::string>(value,os);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }